

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O2

void return_event(event_path_data evp,event_item *event)

{
  event_pkg_contents eVar1;
  FILE *pFVar2;
  int iVar3;
  __pid_t _Var4;
  pthread_t pVar5;
  void *data;
  timespec ts;
  
  event->ref_count = event->ref_count + -1;
  if (event->ref_count != 0) {
    return;
  }
  eVar1 = event->contents;
  if (eVar1 == Event_App_Owned) {
    if (event->free_func != (EVFreeFunction)0x0) {
      (*event->free_func)(event->free_arg,(void *)0x0);
    }
  }
  else if (eVar1 == Event_Freeable) {
    (*event->free_func)(event->decoded_event,event->free_arg);
  }
  else if (eVar1 == Event_CM_Owned) {
    if (event->decoded_event == (void *)0x0) {
      iVar3 = CMtrace_val[9];
      if (event->cm->CMTrace_file == (FILE *)0x0) {
        iVar3 = CMtrace_init(event->cm,CMBufferVerbose);
      }
      if (iVar3 != 0) {
        if (CMtrace_PID != 0) {
          pFVar2 = (FILE *)event->cm->CMTrace_file;
          _Var4 = getpid();
          pVar5 = pthread_self();
          fprintf(pFVar2,"P%lxT%lx - ",(long)_Var4,pVar5);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,(timespec *)&ts);
          fprintf((FILE *)event->cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
        }
        fprintf((FILE *)event->cm->CMTrace_file,"RETURN encoded event %p\n",event->decoded_event);
      }
      fflush((FILE *)event->cm->CMTrace_file);
      data = event->encoded_event;
    }
    else {
      iVar3 = CMtrace_val[9];
      if (event->cm->CMTrace_file == (FILE *)0x0) {
        iVar3 = CMtrace_init(event->cm,CMBufferVerbose);
      }
      if (iVar3 != 0) {
        if (CMtrace_PID != 0) {
          pFVar2 = (FILE *)event->cm->CMTrace_file;
          _Var4 = getpid();
          pVar5 = pthread_self();
          fprintf(pFVar2,"P%lxT%lx - ",(long)_Var4,pVar5);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,(timespec *)&ts);
          fprintf((FILE *)event->cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
        }
        fprintf((FILE *)event->cm->CMTrace_file,"RETURN decoded event %p\n",event->decoded_event);
      }
      fflush((FILE *)event->cm->CMTrace_file);
      data = event->decoded_event;
    }
    INT_CMreturn_buffer(event->cm,data);
  }
  if (event->attrs != (attr_list)0x0) {
    CMint_free_attr_list
              (event->cm,event->attrs,
               "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/evp.c"
               ,0x4d2);
  }
  if (event->ioBuffer != (FFSBuffer)0x0) {
    free_FFSBuffer();
  }
  free(event);
  return;
}

Assistant:

extern void
return_event(event_path_data evp, event_item *event)
{
    (void)evp;
    event->ref_count--;
    if (event->ref_count == 0) {
	/* return event memory */
	switch (event->contents) {
	case Event_CM_Owned:
	    if (event->decoded_event) {
		CMtrace_out(event->cm, CMBufferVerbose, "RETURN decoded event %p\n", event->decoded_event);
		INT_CMreturn_buffer(event->cm, event->decoded_event);
	    } else {
		CMtrace_out(event->cm, CMBufferVerbose, "RETURN encoded event %p\n", event->decoded_event);
		INT_CMreturn_buffer(event->cm, event->encoded_event);
	    }
	    break;
	case Event_Freeable:
	    (event->free_func)(event->decoded_event, event->free_arg);
	    break;
	case Event_App_Owned:
	    if (event->free_func) {
		(event->free_func)(event->free_arg, NULL);
	    }
	    break;
	}
	if (event->attrs != NULL) INT_CMfree_attr_list(event->cm, event->attrs);
	if (event->ioBuffer != NULL)
	    free_FFSBuffer(event->ioBuffer);
	free(event);
    }
}